

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O0

void nni_tcp_dial(nni_tcp_dialer *d,nni_sockaddr *sa,nni_aio *aio)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  nng_err nVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  int nd;
  int ka;
  int rv;
  int fd;
  size_t sslen;
  sockaddr_storage ss;
  nni_tcp_conn *c;
  nni_aio *aio_local;
  nni_sockaddr *sa_local;
  nni_tcp_dialer *d_local;
  
  nni_aio_reset(aio);
  sVar6 = nni_posix_nn2sockaddr(&sslen,sa);
  if ((sVar6 == 0) || (((ushort)sslen != 2 && ((ushort)sslen != 10)))) {
    nni_aio_finish_error(aio,NNG_EADDRINVAL);
  }
  else {
    iVar3 = socket((uint)(ushort)sslen,0x80001,0);
    if (iVar3 < 0) {
      piVar7 = __errno_location();
      nVar4 = nni_plat_errno(*piVar7);
      nni_aio_finish_error(aio,nVar4);
    }
    else {
      nVar4 = nni_posix_tcp_alloc((nni_tcp_conn **)&ss.__ss_align,d,iVar3);
      if (nVar4 == NNG_OK) {
        nni_refcnt_hold(&d->ref);
        nni_mtx_lock(&d->mtx);
        _Var2 = nni_aio_start(aio,tcp_dialer_cancel,d);
        if (_Var2) {
          if ((d->closed & 1U) == 0) {
            if ((d->srclen == 0) ||
               (iVar5 = bind(iVar3,(sockaddr *)&d->src,(socklen_t)d->srclen), iVar5 == 0)) {
              *(nni_aio **)(ss.__ss_align + 0xd0) = aio;
              iVar3 = connect(iVar3,(sockaddr *)&sslen,(socklen_t)sVar6);
              if (iVar3 == 0) {
                *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
                nni_aio_set_prov_data(aio,(void *)0x0);
                _Var2 = d->nodelay;
                _Var1 = d->keepalive;
                nni_mtx_unlock(&d->mtx);
                nni_posix_tcp_start((nni_tcp_conn *)ss.__ss_align,(uint)((_Var2 & 1U) != 0),
                                    (uint)((_Var1 & 1U) != 0));
                nni_aio_set_output(aio,0,(void *)ss.__ss_align);
                nni_aio_finish(aio,NNG_OK,0);
                return;
              }
              piVar7 = __errno_location();
              if (*piVar7 == 0x73) {
                nd = nni_posix_pfd_arm((nni_posix_pfd *)(ss.__ss_align + 0x38),4);
                if (nd == 0) {
                  nni_aio_set_prov_data(aio,(void *)ss.__ss_align);
                  nni_list_append(&d->connq,aio);
                  nni_mtx_unlock(&d->mtx);
                  return;
                }
              }
              else {
                piVar7 = __errno_location();
                nd = nni_plat_errno(*piVar7);
              }
            }
            else {
              piVar7 = __errno_location();
              nd = nni_plat_errno(*piVar7);
            }
          }
          else {
            nd = 7;
          }
          *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
          nni_aio_set_prov_data(aio,(void *)0x0);
          nni_mtx_unlock(&d->mtx);
          nng_stream_close((nng_stream *)ss.__ss_align);
          nng_stream_stop((nng_stream *)ss.__ss_align);
          nng_stream_free((nng_stream *)ss.__ss_align);
          nni_aio_finish_error(aio,nd);
        }
        else {
          nni_mtx_unlock(&d->mtx);
          nng_stream_free((nng_stream *)ss.__ss_align);
        }
      }
      else {
        close(iVar3);
        nni_aio_finish_error(aio,nVar4);
      }
    }
  }
  return;
}

Assistant:

void
nni_tcp_dial(nni_tcp_dialer *d, const nni_sockaddr *sa, nni_aio *aio)
{
	nni_tcp_conn           *c;
	struct sockaddr_storage ss;
	size_t                  sslen;
	int                     fd;
	int                     rv;
	int                     ka;
	int                     nd;

	nni_aio_reset(aio);

	if (((sslen = nni_posix_nn2sockaddr(&ss, sa)) == 0) ||
	    ((ss.ss_family != AF_INET) && (ss.ss_family != AF_INET6))) {
		nni_aio_finish_error(aio, NNG_EADDRINVAL);
		return;
	}

	if ((fd = socket(ss.ss_family, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		nni_aio_finish_error(aio, nni_plat_errno(errno));
		return;
	}

	if ((rv = nni_posix_tcp_alloc(&c, d, fd)) != 0) {
		(void) close(fd);
		nni_aio_finish_error(aio, rv);
		return;
	}

	// hold for the stream
	nni_refcnt_hold(&d->ref);

	nni_mtx_lock(&d->mtx);
	if (!nni_aio_start(aio, tcp_dialer_cancel, d)) {
		nni_mtx_unlock(&d->mtx);
		nng_stream_free(&c->stream);
		return;
	}

	if (d->closed) {
		rv = NNG_ECLOSED;
		goto error;
	}
	if (d->srclen != 0) {
		if (bind(fd, (void *) &d->src, d->srclen) != 0) {
			rv = nni_plat_errno(errno);
			goto error;
		}
	}
	c->dial_aio = aio;
	if (connect(fd, (void *) &ss, sslen) != 0) {
		if (errno != EINPROGRESS) {
			rv = nni_plat_errno(errno);
			goto error;
		}
		// Asynchronous connect.
		if ((rv = nni_posix_pfd_arm(&c->pfd, NNI_POLL_OUT)) != 0) {
			goto error;
		}
		nni_aio_set_prov_data(aio, c);
		nni_list_append(&d->connq, aio);
		nni_mtx_unlock(&d->mtx);
		return;
	}
	// Immediate connect, cool!  This probably only happens
	// on loop back, and probably not on every platform.
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nd = d->nodelay ? 1 : 0;
	ka = d->keepalive ? 1 : 0;
	nni_mtx_unlock(&d->mtx);
	nni_posix_tcp_start(c, nd, ka);
	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
	return;

error:
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);
	nng_stream_close(&c->stream);
	nng_stream_stop(&c->stream);
	nng_stream_free(&c->stream);
	nni_aio_finish_error(aio, rv);
}